

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureBaseGL.cpp
# Opt level: O1

void __thiscall Diligent::TextureBaseGL::~TextureBaseGL(TextureBaseGL *this)

{
  IBuffer *pIVar1;
  RenderDeviceGLImpl *this_00;
  
  (this->super_TextureBase<Diligent::EngineGLImplTraits>).
  super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>.
  super_ObjectBase<Diligent::ITextureGL>.super_RefCountedObject<Diligent::ITextureGL>.
  super_ITextureGL.super_ITexture.super_IDeviceObject = (IDeviceObject)&PTR_QueryInterface_00423468;
  this_00 = DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
            ::GetDevice((DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                         *)this);
  RenderDeviceGLImpl::OnReleaseTexture(this_00,(ITexture *)this);
  pIVar1 = (this->m_pPBO).m_pObject;
  if (pIVar1 != (IBuffer *)0x0) {
    (*(pIVar1->super_IDeviceObject).super_IObject._vptr_IObject[2])();
    (this->m_pPBO).m_pObject = (IBuffer *)0x0;
  }
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper>::Release
            (&this->m_GlTexture);
  TextureBase<Diligent::EngineGLImplTraits>::~TextureBase
            (&this->super_TextureBase<Diligent::EngineGLImplTraits>);
  return;
}

Assistant:

TextureBaseGL::~TextureBaseGL()
{
    // Release all FBOs that contain current texture
    // NOTE: we cannot check if BIND_RENDER_TARGET
    // flag is set, because CopyData() can bind
    // texture as render target even when no flag
    // is set
    GetDevice()->OnReleaseTexture(this);
}